

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O3

int compute_reciprocal(UINT16 divisor,DCTELEM *dtbl)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined6 in_register_0000003a;
  int iVar8;
  uint uVar9;
  ushort uVar10;
  bool bVar11;
  
  uVar7 = (uint)CONCAT62(in_register_0000003a,divisor);
  if (uVar7 == 0) {
    iVar8 = 0;
  }
  else {
    if (uVar7 == 1) {
      *dtbl = 1;
      dtbl[0x40] = 0;
      dtbl[0x80] = 1;
      dtbl[0xc0] = -0x10;
      return 0;
    }
    bVar11 = 0xff < divisor;
    uVar10 = divisor << 8;
    if (bVar11) {
      uVar10 = divisor;
    }
    iVar3 = (uint)bVar11 * 8 + 4;
    uVar4 = uVar10 << 4;
    if (0xfff < uVar10) {
      iVar3 = (uint)bVar11 * 8 + 8;
      uVar4 = uVar10;
    }
    iVar8 = iVar3 + -2;
    uVar10 = uVar4 * 4;
    if (0x3fff < uVar4) {
      iVar8 = iVar3;
      uVar10 = uVar4;
    }
    iVar8 = iVar8 - (uint)(-1 < (short)uVar10);
  }
  uVar1 = CONCAT62(in_register_0000003a,divisor) & 0xffffffff;
  uVar2 = (ulong)(uint)(0x8000 << ((byte)iVar8 & 0x1f));
  uVar5 = uVar2 / uVar1;
  uVar10 = divisor >> 1;
  uVar6 = (uint)(uVar2 % uVar1);
  if (uVar6 == 0) {
    uVar5 = (ulong)((uint)uVar5 >> 1);
    uVar9 = iVar8 + 0xe;
  }
  else {
    uVar9 = iVar8 + 0xf;
    if (uVar7 >> 1 < uVar6) {
      uVar5 = (ulong)((uint)uVar5 + 1);
    }
    else {
      uVar10 = uVar10 + 1;
    }
  }
  *dtbl = (DCTELEM)uVar5;
  dtbl[0x40] = uVar10;
  dtbl[0x80] = (DCTELEM)(1 << (-(char)uVar9 & 0x1fU));
  dtbl[0xc0] = (short)uVar9 + -0x10;
  return (int)(0x10 < uVar9);
}

Assistant:

LOCAL(int)
compute_reciprocal(UINT16 divisor, DCTELEM *dtbl)
{
  UDCTELEM2 fq, fr;
  UDCTELEM c;
  int b, r;

  if (divisor == 1) {
    /* divisor == 1 means unquantized, so these reciprocal/correction/shift
     * values will cause the C quantization algorithm to act like the
     * identity function.  Since only the C quantization algorithm is used in
     * these cases, the scale value is irrelevant.
     */
    dtbl[DCTSIZE2 * 0] = (DCTELEM)1;                        /* reciprocal */
    dtbl[DCTSIZE2 * 1] = (DCTELEM)0;                        /* correction */
    dtbl[DCTSIZE2 * 2] = (DCTELEM)1;                        /* scale */
    dtbl[DCTSIZE2 * 3] = -(DCTELEM)(sizeof(DCTELEM) * 8);   /* shift */
    return 0;
  }

  b = flss(divisor) - 1;
  r  = sizeof(DCTELEM) * 8 + b;

  fq = ((UDCTELEM2)1 << r) / divisor;
  fr = ((UDCTELEM2)1 << r) % divisor;

  c = divisor / 2;                      /* for rounding */

  if (fr == 0) {                        /* divisor is power of two */
    /* fq will be one bit too large to fit in DCTELEM, so adjust */
    fq >>= 1;
    r--;
  } else if (fr <= (divisor / 2U)) {    /* fractional part is < 0.5 */
    c++;
  } else {                              /* fractional part is > 0.5 */
    fq++;
  }

  dtbl[DCTSIZE2 * 0] = (DCTELEM)fq;     /* reciprocal */
  dtbl[DCTSIZE2 * 1] = (DCTELEM)c;      /* correction + roundfactor */
#ifdef WITH_SIMD
  dtbl[DCTSIZE2 * 2] = (DCTELEM)(1 << (sizeof(DCTELEM) * 8 * 2 - r)); /* scale */
#else
  dtbl[DCTSIZE2 * 2] = 1;
#endif
  dtbl[DCTSIZE2 * 3] = (DCTELEM)r - sizeof(DCTELEM) * 8; /* shift */

  if (r <= 16) return 0;
  else return 1;
}